

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.hpp
# Opt level: O0

uint8_t plot::ansi::detail::find_color256(Color c)

{
  long lVar1;
  detail *in_RSI;
  float fVar2;
  undefined4 extraout_XMM0_Db;
  Color32 local_84;
  Color local_80;
  float local_6c;
  float gray_dist;
  float local_58;
  float local_54;
  float color_dist;
  float ansi_dist;
  uint8_t gray;
  pair<int,_bool> pStack_48;
  Color32 color;
  undefined1 local_34 [8];
  ansi_palette_entry ansi_clr;
  Color c_local;
  
  pStack_48 = c._0_8_;
  ansi_clr.second = pStack_48;
  find_palette_entry((ansi_palette_entry *)local_34,in_RSI,c);
  ansi_dist = (float)Color::color32((Color *)&ansi_clr.second,'\x05',0xff);
  c_local.r = c.b;
  fVar2 = utils::clamp<float>(c_local.r * 0.11 +
                              (float)ansi_clr.second.first * 0.3 +
                              (float)ansi_clr.second._4_4_ * 0.59,0.0,1.0);
  lVar1 = std::lround((double)CONCAT44(extraout_XMM0_Db,fVar2 * 23.0));
  color_dist._3_1_ = (char)lVar1;
  local_54 = Color::distance((Color *)local_34,(Color *)&ansi_clr.second);
  local_6c = ansi_dist;
  Color::Color((Color *)&gray_dist,(Color32)ansi_dist,'\x05',0xff);
  local_58 = Color::distance((Color *)&gray_dist,(Color *)&ansi_clr.second);
  local_84.g = color_dist._3_1_;
  local_84.r = color_dist._3_1_;
  local_84.b = color_dist._3_1_;
  local_84.a = 0xff;
  Color::Color(&local_80,local_84,'\x17',0xff);
  fVar2 = Color::distance(&local_80,(Color *)&ansi_clr.second);
  if ((fVar2 < local_58) || (local_54 < local_58)) {
    if (local_54 < fVar2) {
      c_local.b._3_1_ = ansi_clr.first.b._0_1_ + (ansi_clr.first.a._0_1_ & 1) * '\b';
    }
    else {
      c_local.b._3_1_ = color_dist._3_1_ + 0xe8;
    }
  }
  else {
    c_local.b._3_1_ = ansi_dist._0_1_ * '$' + '\x10' + ansi_dist._1_1_ * '\x06' + ansi_dist._2_1_;
  }
  return c_local.b._3_1_;
}

Assistant:

inline std::uint8_t find_color256(plot::Color c) {
            using utils::clamp;
            auto ansi_clr = find_palette_entry(c);
            auto color = c.color32(5);
            std::uint8_t gray = std::lround(clamp(0.3f*c.r + 0.59f*c.g + 0.11f*c.b, 0.0f, 1.0f)*23);

            auto ansi_dist = ansi_clr.first.distance(c);
            auto color_dist = plot::Color(color, 5).distance(c);
            auto gray_dist = plot::Color({ gray, gray, gray, 255 }, 23).distance(c);

            if (color_dist <= gray_dist && color_dist <= ansi_dist) {
                return 16 + 36*color.r + 6*color.g + color.b;
            } else if (gray_dist <= ansi_dist) {
                return gray + 0xe8;
            } else {
                return ansi_clr.second.first + 8*ansi_clr.second.second;
            }
        }